

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

Wlc_Ntk_t * Smt_PrsBuild(Smt_Prs_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar3;
  Abc_Nam_t *pAVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  Wlc_Obj_t *pObj;
  int local_74;
  int nBits;
  int NameId;
  int Range;
  int Status;
  int iObj;
  int Fan3;
  int Fan;
  int k;
  int i;
  char *pValue;
  char *pRange;
  char *pName;
  Vec_Int_t *vAsserts;
  Vec_Int_t *vFans3;
  Vec_Int_t *vFans2;
  Vec_Int_t *vFans;
  Wlc_Ntk_t *pNtk;
  Smt_Prs_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  local_74 = 0;
  pVVar3 = Vec_WecEntry(&p->vObjs,0);
  for (Fan = 0; iVar1 = Vec_IntSize(pVVar3), Fan < iVar1; Fan = Fan + 1) {
    iVar1 = Vec_IntEntry(pVVar3,Fan);
    iVar1 = Smt_EntryIsName(iVar1);
    if (iVar1 != 0) {
      __assert_fail("!Smt_EntryIsName(Fan)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                    ,0x1ec,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
    }
    pVVar6 = Smt_VecEntryNode(p,pVVar3,Fan);
    iVar1 = Vec_IntEntry(pVVar6,0);
    iVar2 = Smt_EntryIsName(iVar1);
    if (iVar2 == 0) {
      __assert_fail("Smt_EntryIsName(Fan)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                    ,0x1ef,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
    }
    iVar2 = Abc_Lit2Var(iVar1);
    if (10 < iVar2) {
      pcVar7 = Smt_EntryName(p,iVar1);
      printf("Ignoring directive \"%s\".\n",pcVar7);
    }
  }
  vFans = (Vec_Int_t *)Wlc_NtkAlloc(p->pName,1000);
  pAVar4 = Abc_NamStart(1000,0x18);
  ((Wlc_Ntk_t *)vFans)->pManName = pAVar4;
  ((Wlc_Ntk_t *)vFans)->fSmtLib = 1;
  for (Fan = 0; iVar1 = Vec_WecSize(&p->vObjs), Fan < iVar1; Fan = Fan + 1) {
    pVVar3 = Vec_WecEntry(&p->vObjs,Fan);
    iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_DECLARE_FUN);
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 != 4) {
        __assert_fail("Vec_IntSize(vFans) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1f9,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_DECLARE_FUN);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1fa,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,1);
      iVar2 = Smt_EntryIsName(iVar1);
      if (iVar2 == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1fd,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pcVar7 = Smt_EntryName(p,iVar1);
      iVar1 = Vec_IntEntry(pVVar3,2);
      iVar1 = Smt_EntryIsName(iVar1);
      if (iVar1 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x201,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,3);
      iVar1 = Smt_EntryIsName(iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(pVVar3,3);
        iVar2 = Smt_EntryIsName(iVar1);
        if (iVar2 != 0) {
          __assert_fail("!Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x20f,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pVVar3 = Smt_EntryNode(p,iVar1);
        iVar1 = Vec_IntSize(pVVar3);
        if (iVar1 != 3) {
          __assert_fail("Vec_IntSize(vFans2) == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x211,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_VecEntryName(p,pVVar3,0);
        iVar1 = strcmp("_",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x212,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_VecEntryName(p,pVVar3,1);
        iVar1 = strcmp("BitVec",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x213,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        iVar1 = Vec_IntEntry(pVVar3,2);
        iVar2 = Smt_EntryIsName(iVar1);
        if (iVar2 == 0) {
          __assert_fail("Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x215,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_EntryName(p,iVar1);
        nBits = atoi(pcVar5);
      }
      else {
        pcVar5 = Smt_VecEntryName(p,pVVar3,3);
        iVar1 = strcmp("Bool",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x207,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        nBits = 1;
      }
      iVar1 = Wlc_ObjAlloc((Wlc_Ntk_t *)vFans,1,0,nBits + -1,0);
      iVar2 = Abc_NamStrFindOrAdd(((Wlc_Ntk_t *)vFans)->pManName,pcVar7,(int *)0x0);
      if (iVar1 != iVar2) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x21c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      Vec_IntPush(&((Wlc_Ntk_t *)vFans)->vValues,iVar2);
      Vec_IntPush(&((Wlc_Ntk_t *)vFans)->vValues,local_74);
      Vec_IntPush(&((Wlc_Ntk_t *)vFans)->vValues,nBits);
      local_74 = nBits + local_74;
    }
  }
  for (Fan = 0; iVar1 = Vec_WecSize(&p->vObjs), Fan < iVar1; Fan = Fan + 1) {
    pVVar3 = Vec_WecEntry(&p->vObjs,Fan);
    iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_DEFINE_FUN);
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 != 5) {
        __assert_fail("Vec_IntSize(vFans) == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x226,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_DEFINE_FUN);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x227,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,1);
      iVar2 = Smt_EntryIsName(iVar1);
      if (iVar2 == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x22a,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pcVar7 = Smt_EntryName(p,iVar1);
      iVar1 = Vec_IntEntry(pVVar3,2);
      iVar1 = Smt_EntryIsName(iVar1);
      if (iVar1 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x22e,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,3);
      iVar1 = Smt_EntryIsName(iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(pVVar3,3);
        iVar1 = Smt_EntryIsName(iVar1);
        if (iVar1 != 0) {
          __assert_fail("!Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x244,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pVVar6 = Smt_VecEntryNode(p,pVVar3,3);
        iVar1 = Vec_IntSize(pVVar6);
        if (iVar1 != 3) {
          __assert_fail("Vec_IntSize(vFans2) == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x246,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_VecEntryName(p,pVVar6,0);
        iVar1 = strcmp("_",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x247,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_VecEntryName(p,pVVar6,1);
        iVar1 = strcmp("BitVec",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x248,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        iVar1 = Vec_IntEntry(pVVar6,2);
        iVar2 = Smt_EntryIsName(iVar1);
        if (iVar2 == 0) {
          __assert_fail("Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x24b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_EntryName(p,iVar1);
        iVar1 = atoi(pcVar5);
        iVar2 = Vec_IntEntry(pVVar3,4);
        NameId = Smt_PrsBuildNode((Wlc_Ntk_t *)vFans,p,iVar2,iVar1,pcVar7);
      }
      else {
        pcVar5 = Smt_VecEntryName(p,pVVar3,3);
        iVar1 = strcmp("Bool",pcVar5);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x234,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar5 = Smt_VecEntryName(p,pVVar3,4);
        iVar1 = strcmp("false",pcVar5);
        if (iVar1 == 0) {
          _k = "#b0";
        }
        else {
          iVar1 = strcmp("true",pcVar5);
          if (iVar1 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x23b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          _k = "#b1";
        }
        NameId = Smt_PrsBuildConstant((Wlc_Ntk_t *)vFans,_k,1,pcVar7);
      }
      if (NameId == 0) {
        Wlc_NtkFree((Wlc_Ntk_t *)vFans);
        vFans = (Vec_Int_t *)0x0;
        goto LAB_003b0cd8;
      }
    }
  }
  for (Fan = 0; iVar1 = Vec_WecSize(&p->vObjs), Fan < iVar1; Fan = Fan + 1) {
    pVVar3 = Vec_WecEntry(&p->vObjs,Fan);
    iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_LET);
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x25c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_LET);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x25d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar3,1);
      iVar2 = Smt_EntryIsName(iVar1);
      if (iVar2 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x260,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pVVar3 = Smt_EntryNode(p,iVar1);
      iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_LET);
      if (iVar1 == 0) {
        for (Fan3 = 0; iVar1 = Vec_IntSize(pVVar3), Fan3 < iVar1; Fan3 = Fan3 + 1) {
          Vec_IntEntry(pVVar3,Fan3);
          iVar1 = Vec_IntEntry(pVVar3,0);
          iVar2 = Smt_EntryIsName(iVar1);
          if (iVar2 != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x269,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pVVar6 = Smt_EntryNode(p,iVar1);
          iVar1 = Vec_IntEntry(pVVar6,0);
          iVar2 = Smt_EntryIsName(iVar1);
          if (iVar2 == 0) {
            __assert_fail("Smt_EntryIsName(Fan3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x26d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar7 = Smt_EntryName(p,iVar1);
          iVar1 = Vec_IntEntry(pVVar6,1);
          iVar2 = Smt_EntryIsName(iVar1);
          if (iVar2 != 0) {
            __assert_fail("!Smt_EntryIsName(Fan3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x271,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          iVar1 = Smt_PrsBuildNode((Wlc_Ntk_t *)vFans,p,iVar1,-1,pcVar7);
          if (iVar1 == 0) {
            Wlc_NtkFree((Wlc_Ntk_t *)vFans);
            vFans = (Vec_Int_t *)0x0;
            goto LAB_003b0cd8;
          }
        }
      }
    }
  }
  Vec_IntClear(p_00);
  Fan = 0;
  do {
    iVar1 = Vec_WecSize(&p->vObjs);
    if (iVar1 <= Fan) {
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 == 1) {
        Range = Smt_PrsCreateNode((Wlc_Ntk_t *)vFans,7,0,1,p_00,"miter_output");
      }
      else {
        iVar1 = Vec_IntSize(p_00);
        iVar1 = Smt_PrsCreateNode((Wlc_Ntk_t *)vFans,0x17,0,iVar1,p_00,(char *)0x0);
        Vec_IntFill(p_00,1,iVar1);
        Range = Smt_PrsCreateNode((Wlc_Ntk_t *)vFans,0x25,0,1,p_00,"miter_output");
      }
      pObj = Wlc_NtkObj((Wlc_Ntk_t *)vFans,Range);
      Wlc_ObjSetCo((Wlc_Ntk_t *)vFans,pObj,0);
      iVar1 = Wlc_NtkObjNumMax((Wlc_Ntk_t *)vFans);
      pVVar3 = Vec_IntStartNatural(iVar1);
      Vec_IntAppend(&((Wlc_Ntk_t *)vFans)->vNameIds,pVVar3);
      Vec_IntFree(pVVar3);
LAB_003b0cd8:
      Vec_IntFree(p_00);
      return (Wlc_Ntk_t *)vFans;
    }
    pVVar3 = Vec_WecEntry(&p->vObjs,Fan);
    iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_ASSERT);
    if (iVar1 != 0) {
      iVar1 = Vec_IntSize(pVVar3);
      if (iVar1 != 2) {
        __assert_fail("Vec_IntSize(vFans) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x282,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar3,0,SMT_PRS_ASSERT);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x283,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iObj = Vec_IntEntry(pVVar3,1);
      iVar1 = Smt_EntryIsName(iObj);
      if (iVar1 == 0) {
        vFans3 = Smt_VecEntryNode(p,pVVar3,1);
        while (iVar1 = Smt_VecEntryIsType(vFans3,0,SMT_PRS_LET), iVar1 != 0) {
          iObj = Vec_IntEntry(vFans3,2);
          iVar1 = Smt_EntryIsName(iObj);
          if (iVar1 != 0) break;
          vFans3 = Smt_VecEntryNode(p,vFans3,2);
        }
      }
      iVar1 = Smt_PrsBuildNode((Wlc_Ntk_t *)vFans,p,iObj,-1,(char *)0x0);
      if (iVar1 == 0) {
        Wlc_NtkFree((Wlc_Ntk_t *)vFans);
        vFans = (Vec_Int_t *)0x0;
        goto LAB_003b0cd8;
      }
      Vec_IntPush(p_00,iVar1);
    }
    Fan = Fan + 1;
  } while( true );
}

Assistant:

Wlc_Ntk_t * Smt_PrsBuild( Smt_Prs_t * p )
{
    Wlc_Ntk_t * pNtk;
    Vec_Int_t * vFans, * vFans2, * vFans3; 
    Vec_Int_t * vAsserts = Vec_IntAlloc(100);
    char * pName, * pRange, * pValue;
    int i, k, Fan, Fan3, iObj, Status, Range, NameId, nBits = 0;
    // issue warnings about unknown dirs
    vFans = Vec_WecEntry( &p->vObjs, 0 );
    Vec_IntForEachEntry( vFans, Fan, i )
    {
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_VecEntryNode( p, vFans, i );
        Fan = Vec_IntEntry(vFans2, 0);
        assert( Smt_EntryIsName(Fan) );
        if ( Abc_Lit2Var(Fan) >= SMT_PRS_END )
            printf( "Ignoring directive \"%s\".\n", Smt_EntryName(p, Fan) );
    }
    // start network and create primary inputs
    pNtk = Wlc_NtkAlloc( p->pName, 1000 );
    pNtk->pManName = Abc_NamStart( 1000, 24 );
    pNtk->fSmtLib = 1;
    Smt_ManForEachDir( p, SMT_PRS_DECLARE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 4 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            //(declare-fun s1 () Bool)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
        }
        else
        {
            // (declare-fun s1 () (_ BitVec 64))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_EntryNode(p, Fan);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
        }
        // create node
        iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, 0, Range-1, 0 );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, NULL );
        assert( iObj == NameId );
        // save values
        Vec_IntPush( &pNtk->vValues, NameId );
        Vec_IntPush( &pNtk->vValues, nBits );
        Vec_IntPush( &pNtk->vValues, Range );
        nBits += Range;
    }
    // create constants
    Smt_ManForEachDir( p, SMT_PRS_DEFINE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 5 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            // (define-fun s_2 () Bool false)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
            pValue = Smt_VecEntryName(p, vFans, 4);
            if ( !strcmp("false", pValue) )
                pValue = "#b0";
            else if ( !strcmp("true", pValue) )
                pValue = "#b1";
            else assert( 0 );
            Status = Smt_PrsBuildConstant( pNtk, pValue, Range, pName );
        }
        else
        {
            // (define-fun s702 () (_ BitVec 4) #xe)
            // (define-fun s1 () (_ BitVec 8) (bvneg #x7f))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_VecEntryNode(p, vFans, 3);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            // get range
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
            // get constant
            Fan = Vec_IntEntry(vFans, 4);
            Status = Smt_PrsBuildNode( pNtk, p, Fan, Range, pName );
        }        
        if ( !Status )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
    }
    // process let-statements
    Smt_ManForEachDir( p, SMT_PRS_LET, vFans, i )
    {
        // let ((s35550 (bvor s48 s35549)))
        assert( Vec_IntSize(vFans) == 3 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET) );
        // get parts
        Fan = Vec_IntEntry(vFans, 1);
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_EntryNode(p, Fan);
        if ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            continue;
        // iterate through the parts
        Vec_IntForEachEntry( vFans2, Fan, k )
        {
            // s35550 (bvor s48 s35549)
            Fan = Vec_IntEntry(vFans2, 0);
            assert( !Smt_EntryIsName(Fan) );
            vFans3 = Smt_EntryNode(p, Fan);
            // get the name
            Fan3 = Vec_IntEntry(vFans3, 0);
            assert( Smt_EntryIsName(Fan3) );
            pName = Smt_EntryName(p, Fan3);
            // get function
            Fan3 = Vec_IntEntry(vFans3, 1);
            assert( !Smt_EntryIsName(Fan3) );
            Status = Smt_PrsBuildNode( pNtk, p, Fan3, -1, pName );
            if ( !Status )
            {
                Wlc_NtkFree( pNtk ); pNtk = NULL;
                goto finish;
            }
        }
    }
    // process assert-statements
    Vec_IntClear( vAsserts );
    Smt_ManForEachDir( p, SMT_PRS_ASSERT, vFans, i )
    {
        //(assert ; no quantifiers
        //   (let ((s2 (bvsge s0 s1)))
        //   (not s2)))
        //(assert (not (= s0 #x00)))
        assert( Vec_IntSize(vFans) == 2 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT) );
        // get second directive
        Fan = Vec_IntEntry(vFans, 1);
        if ( !Smt_EntryIsName(Fan) )
        {
            // find the final let-statement
            vFans2 = Smt_VecEntryNode(p, vFans, 1);
            while ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            {
                Fan = Vec_IntEntry(vFans2, 2);
                if ( Smt_EntryIsName(Fan) )
                    break;
                vFans2 = Smt_VecEntryNode(p, vFans2, 2);
            }
        }
        // find name or create node
        iObj = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
        if ( !iObj )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
        Vec_IntPush( vAsserts, iObj );
    }
    // build AND of asserts
    if ( Vec_IntSize(vAsserts) == 1 )
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BUF, 0, 1, vAsserts, "miter_output" );
    else
    {
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vAsserts), vAsserts, NULL );
        Vec_IntFill( vAsserts, 1, iObj );
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_REDUCT_AND, 0, 1, vAsserts, "miter_output" );
    }
    Wlc_ObjSetCo( pNtk, Wlc_NtkObj(pNtk, iObj), 0 );
    // create nameIDs
    vFans = Vec_IntStartNatural( Wlc_NtkObjNumMax(pNtk) );
    Vec_IntAppend( &pNtk->vNameIds, vFans );
    Vec_IntFree( vFans );
    //Wlc_NtkReport( pNtk, NULL );
finish:
    // cleanup
    Vec_IntFree(vAsserts);
    return pNtk;
}